

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::AssertCoroutine(NULLCRef f)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if (pEVar1->subCat != CAT_FUNCTION) {
    nullcThrowError("Argument is not a function");
  }
  pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                     ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                      *(uint *)(CONCAT44(f.typeID,in_stack_0000000c) + 8));
  if (pEVar2->funcCat == '\x03') {
    return;
  }
  nullcThrowError("ERROR: function is not a coroutine");
  return;
}

Assistant:

void NULLC::AssertCoroutine(NULLCRef f)
{
	if(linker->exTypes[f.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		nullcThrowError("Argument is not a function");

	NULLCFuncPtr *fPtr = (NULLCFuncPtr*)f.ptr;
	if(linker->exFunctions[fPtr->id].funcCat != ExternFuncInfo::COROUTINE)
		nullcThrowError("ERROR: function is not a coroutine");
}